

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void fall_through(boolean td)

{
  bool bVar1;
  xchar xVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  trap *trap;
  char *pcVar6;
  char **local_150;
  trap *t;
  int newlevel;
  int currentlevel;
  char *dont_fall;
  char msgbuf [256];
  d_level local_b;
  boolean local_9;
  d_level dtmp;
  boolean td_local;
  
  _newlevel = (char *)0x0;
  local_9 = td;
  xVar2 = dunlev(&u.uz);
  iVar4 = (int)xVar2;
  t._0_4_ = iVar4;
  if ((((u.uprops[0x1e].intrinsic == 0) &&
       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
      (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
       ((u.uprops[0x12].intrinsic == 0 &&
        ((u.uprops[0x12].extrinsic == 0 && ((youmonst.data)->mlet != '\x05')))))))) ||
     (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
    do {
      t._0_4_ = (int)t + 1;
      iVar5 = rn2(4);
      bVar1 = false;
      if (iVar5 == 0) {
        xVar2 = dunlevs_in_dungeon(&u.uz);
        bVar1 = (int)t < xVar2;
      }
    } while (bVar1);
    if (local_9 == '\0') {
      pcVar6 = surface((int)u.ux,(int)u.uy);
      pline("The %s opens up under you!",pcVar6);
    }
    else {
      trap = t_at(level,(int)u.ux,(int)u.uy);
      seetrap(trap);
      if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
        if ((trap->field_0x8 & 0x1f) == 0xe) {
          pline("A trap door opens up under you!");
        }
        else {
          pline("There\'s a gaping hole under you!");
        }
      }
    }
    if ((u.uz.dnum != dungeon_topology.d_sokoban_dnum) ||
       (bVar3 = can_fall_thru(level), bVar3 == '\0')) {
      if (((((u.uprops[0x12].intrinsic == 0) &&
            (((u.uprops[0x12].extrinsic == 0 && ((youmonst.data)->mlet != '\x05')) &&
             (u.ustuck == (monst *)0x0)))) &&
           (((bVar3 = can_fall_thru(level), bVar3 != '\0' && (u.uprops[0x3c].extrinsic == 0)) &&
            (((youmonst.data)->mflags1 & 1) == 0)))) &&
          ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) &&
         ((((youmonst.data)->mflags1 & 0x10) == 0 &&
          (((bVar3 = In_hell(&u.uz), bVar3 == '\0' || (((ushort)u.uevent._0_2_ >> 9 & 1) != 0)) ||
           (xVar2 = dunlevs_in_dungeon(&u.uz), (int)t != xVar2)))))) {
        if ((youmonst.data)->msize < 4) {
          bVar3 = next_to_u();
          if (bVar3 == '\0') {
            _newlevel = "You are jerked back by your pet!";
          }
        }
        else {
          _newlevel = "You don\'t fit through.";
        }
      }
      else {
        _newlevel = "You don\'t fall in.";
      }
    }
    if (_newlevel == (char *)0x0) {
      if (u.ushops[0] != '\0') {
        shopdig(1);
      }
      bVar3 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
      if (bVar3 == '\0') {
        local_b.dnum = u.uz.dnum;
        local_b.dlevel = (xchar)t;
        if ((int)t - iVar4 != 1) {
          if (((int)t - iVar4) - 2U < 4) {
            pline(fall_through::falling_down_msgs[((int)t - iVar4) + -2]);
          }
          else {
            pline("You are falling down an unbelievably deep shaft!");
            pline("While falling you wonder how unlikely it is to find such a deep shaft.");
          }
        }
      }
      else {
        find_hell(&local_b);
      }
      if (local_9 == '\0') {
        pcVar6 = ceiling((int)u.ux,(int)u.uy);
        sprintf((char *)&dont_fall,"The hole in the %s above you closes up.",pcVar6);
      }
      if (local_9 == '\0') {
        local_150 = &dont_fall;
      }
      else {
        local_150 = (char **)0x0;
      }
      schedule_goto(&local_b,'\0','\x01',0,(char *)0x0,(char *)local_150);
    }
    else {
      pline(_newlevel);
      impact_drop((obj *)0x0,u.ux,u.uy,'\0');
      if (local_9 == '\0') {
        (*windowprocs.win_pause)(P_MESSAGE);
        pline("The opening under you closes up.");
      }
    }
  }
  return;
}

Assistant:

void fall_through(boolean td)	/* td == TRUE : trap door or hole */
{
	d_level dtmp;
	char msgbuf[BUFSZ];
	const char *dont_fall = NULL;
	int currentlevel = dunlev(&u.uz);
	int newlevel = currentlevel;

	/* KMH -- You can't escape the Sokoban level traps */
	if (Blind && Levitation && !In_sokoban(&u.uz)) return;

	do {
	    newlevel++;
	} while (!rn2(4) && newlevel < dunlevs_in_dungeon(&u.uz));

	if (td) {
	    struct trap *t=t_at(level, u.ux,u.uy);
	    seetrap(t);
	    if (!In_sokoban(&u.uz)) {
		if (t->ttyp == TRAPDOOR)
			pline("A trap door opens up under you!");
		else 
			pline("There's a gaping hole under you!");
	    }
	} else pline("The %s opens up under you!", surface(u.ux,u.uy));

	if (In_sokoban(&u.uz) && can_fall_thru(level))
	    ;	/* KMH -- You can't escape the Sokoban level traps */
	else if (Levitation || u.ustuck || !can_fall_thru(level)
	   || Flying || is_clinger(youmonst.data)
	   || (Inhell && !u.uevent.invoked &&
					newlevel == dunlevs_in_dungeon(&u.uz))
		) {
	    dont_fall = "You don't fall in.";
	} else if (youmonst.data->msize >= MZ_HUGE) {
	    dont_fall = "You don't fit through.";
	} else if (!next_to_u()) {
	    dont_fall = "You are jerked back by your pet!";
	}
	if (dont_fall) {
	    pline(dont_fall);
	    /* hero didn't fall through, but any objects here might */
	    impact_drop(NULL, u.ux, u.uy, 0);
	    if (!td) {
		win_pause_output(P_MESSAGE);
		pline("The opening under you closes up.");
	    }
	    return;
	}

	if (*u.ushops) shopdig(1);
	if (Is_stronghold(&u.uz)) {
	    find_hell(&dtmp);
	} else {
	    static const char * const falling_down_msgs[] = {
		"You fall down a shaft!",
		"You fall down a deep shaft!",
		"You keep falling down a really deep shaft!",
		"You keep falling down an unbelievably deep shaft!",
		/* TODO: Hallucination messages */
	    };

	    dtmp.dnum = u.uz.dnum;
	    dtmp.dlevel = newlevel;

	    switch (newlevel - currentlevel) {
	    case 1:
		/* no message when falling to the next level */
		break;
	    case 2:
	    case 3:
	    case 4:
	    case 5:
		pline(falling_down_msgs[newlevel - currentlevel - 2]);
		break;
	    default:
		pline("You are falling down an unbelievably deep shaft!");
		pline("While falling you wonder how unlikely it is "
		      "to find such a deep shaft.");	/* (1/4)^5 ~= 0.1% */
		break;
	    }
	}
	if (!td)
	    sprintf(msgbuf, "The hole in the %s above you closes up.",
		    ceiling(u.ux,u.uy));
	schedule_goto(&dtmp, FALSE, TRUE, 0,
		      NULL, !td ? msgbuf : NULL);
}